

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O2

void Abc_SclDumpGenlib(char *pFileName,SC_Lib *p,float SlewInit,float Gain,int nGatesMin)

{
  FILE *__stream;
  Vec_Str_t *p_00;
  int nCellCount;
  char FileName [1000];
  uint local_40c;
  char local_408 [1000];
  
  local_40c = 0;
  if ((SlewInit == 0.0) && (!NAN(SlewInit))) {
    SlewInit = Abc_SclComputeAverageSlew(p);
  }
  if (pFileName == (char *)0x0) {
    sprintf(local_408,"%s_s%03d_g%03d_m%d.genlib",p->pName,(ulong)(uint)(int)SlewInit,
            (ulong)(uint)(int)Gain,(ulong)(uint)nGatesMin);
  }
  else {
    strcpy(local_408,pFileName);
  }
  __stream = fopen(local_408,"wb");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open file \"%s\" for writing.\n",local_408);
  }
  else {
    p_00 = Abc_SclProduceGenlibStr(p,SlewInit,Gain,nGatesMin,(int *)&local_40c);
    fputs(p_00->pArray,__stream);
    Vec_StrFree(p_00);
    fclose(__stream);
    printf("Written GENLIB library with %d gates into file \"%s\".\n",(ulong)local_40c,local_408);
  }
  return;
}

Assistant:

void Abc_SclDumpGenlib( char * pFileName, SC_Lib * p, float SlewInit, float Gain, int nGatesMin )
{
    int nCellCount = 0;
    char FileName[1000];
    float Slew = (SlewInit == 0) ? Abc_SclComputeAverageSlew(p) : SlewInit;
    Vec_Str_t * vStr;
    FILE * pFile;
    if ( pFileName == NULL )
        sprintf( FileName, "%s_s%03d_g%03d_m%d.genlib", p->pName, (int)Slew, (int)Gain, nGatesMin );
    else
        sprintf( FileName, "%s", pFileName );
    pFile = fopen( FileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\" for writing.\n", FileName );
        return;
    }
    vStr = Abc_SclProduceGenlibStr( p, Slew, Gain, nGatesMin, &nCellCount );
    fprintf( pFile, "%s", Vec_StrArray(vStr) );
    Vec_StrFree( vStr );
    fclose( pFile );
    printf( "Written GENLIB library with %d gates into file \"%s\".\n", nCellCount, FileName );
}